

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array.cpp
# Opt level: O3

bool __thiscall
ON_3dPointArray::Rotate
          (ON_3dPointArray *this,double sin_angle,double cos_angle,ON_3dVector *axis_of_rotation,
          ON_3dPoint *center_of_rotation)

{
  int iVar1;
  ON_3dPoint *pOVar2;
  double dVar3;
  bool bVar4;
  long lVar5;
  ON_SimpleArray<int> fix_index;
  ON_Xform rot;
  int local_d4;
  ON_SimpleArray<int> local_d0;
  double local_b8;
  double local_b0;
  ON_Xform local_a8;
  
  iVar1 = (this->super_ON_SimpleArray<ON_3dPoint>).m_count;
  local_b8 = sin_angle;
  local_b0 = cos_angle;
  ON_Xform::ON_Xform(&local_a8);
  ON_Xform::Rotation(&local_a8,local_b8,local_b0,*axis_of_rotation,*center_of_rotation);
  local_d0._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_00808cb8;
  local_d0.m_a = (int *)0x0;
  local_d0.m_count = 0;
  local_d0.m_capacity = 0;
  ON_SimpleArray<int>::SetCapacity(&local_d0,0x80);
  local_d4 = 0;
  if (0 < iVar1) {
    do {
      bVar4 = ON_3dPoint::operator==
                        ((this->super_ON_SimpleArray<ON_3dPoint>).m_a + local_d4,center_of_rotation)
      ;
      if (bVar4) {
        ON_SimpleArray<int>::Append(&local_d0,&local_d4);
      }
      local_d4 = local_d4 + 1;
    } while (local_d4 < iVar1);
  }
  bVar4 = ON_TransformPointList
                    (3,false,(this->super_ON_SimpleArray<ON_3dPoint>).m_count,3,
                     &((this->super_ON_SimpleArray<ON_3dPoint>).m_a)->x,&local_a8);
  local_d4 = 0;
  if (0 < local_d0.m_count) {
    lVar5 = 0;
    do {
      pOVar2 = (this->super_ON_SimpleArray<ON_3dPoint>).m_a;
      iVar1 = local_d0.m_a[lVar5];
      pOVar2[iVar1].z = center_of_rotation->z;
      dVar3 = center_of_rotation->y;
      pOVar2 = pOVar2 + iVar1;
      pOVar2->x = center_of_rotation->x;
      pOVar2->y = dVar3;
      lVar5 = lVar5 + 1;
      local_d4 = (int)lVar5;
    } while (lVar5 < local_d0.m_count);
  }
  ON_SimpleArray<int>::~ON_SimpleArray(&local_d0);
  return bVar4;
}

Assistant:

bool ON_3dPointArray::Rotate(
      double sin_angle,
      double cos_angle,
      const ON_3dVector& axis_of_rotation,
      const ON_3dPoint& center_of_rotation
      )
{
  const int count = m_count;
  ON_Xform rot;
  rot.Rotation( sin_angle, cos_angle, axis_of_rotation, center_of_rotation );
  ON_SimpleArray<int> fix_index(128);
  int i;
  for ( i = 0; i < count; i++ ) {
    if ( m_a[i] == center_of_rotation )
      fix_index.Append(i);
  }
  const bool rc = Transform( rot );
  for ( i = 0; i < fix_index.Count(); i++ ) {
    m_a[fix_index[i]] = center_of_rotation;
  }
  return rc;
}